

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyResyn.c
# Opt level: O3

Ivy_Man_t * Ivy_ManResyn0(Ivy_Man_t *pMan,int fUpdateLevel,int fVerbose)

{
  int iVar1;
  Ivy_Man_t *p;
  Ivy_Man_t *p_00;
  long lVar2;
  long lVar3;
  int iVar4;
  timespec ts;
  timespec local_38;
  
  if (fVerbose != 0) {
    puts("Original:");
    Ivy_ManPrintStats(pMan);
  }
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  p = Ivy_ManBalance(pMan,fUpdateLevel);
  if (fVerbose != 0) {
    iVar1 = 10;
    putchar(10);
    Abc_Print(iVar1,"%s =","Balance");
    iVar4 = 3;
    iVar1 = clock_gettime(3,&local_38);
    if (iVar1 < 0) {
      lVar3 = -1;
    }
    else {
      lVar3 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
    }
    Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar3 + lVar2) / 1000000.0);
    Ivy_ManPrintStats(p);
  }
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  Ivy_ManRewritePre(p,fUpdateLevel,0,0);
  if (fVerbose != 0) {
    iVar1 = 10;
    putchar(10);
    Abc_Print(iVar1,"%s =","Rewrite");
    iVar4 = 3;
    iVar1 = clock_gettime(3,&local_38);
    if (iVar1 < 0) {
      lVar3 = -1;
    }
    else {
      lVar3 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
    }
    Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar3 + lVar2) / 1000000.0);
    Ivy_ManPrintStats(p);
  }
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  p_00 = Ivy_ManBalance(p,fUpdateLevel);
  Ivy_ManStop(p);
  if (fVerbose != 0) {
    iVar1 = 10;
    putchar(10);
    Abc_Print(iVar1,"%s =","Balance");
    iVar4 = 3;
    iVar1 = clock_gettime(3,&local_38);
    if (iVar1 < 0) {
      lVar3 = -1;
    }
    else {
      lVar3 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
    }
    Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar3 + lVar2) / 1000000.0);
    Ivy_ManPrintStats(p_00);
  }
  return p_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs several passes of rewriting on the AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Ivy_Man_t * Ivy_ManResyn0( Ivy_Man_t * pMan, int fUpdateLevel, int fVerbose )
{
    abctime clk;
    Ivy_Man_t * pTemp;

if ( fVerbose ) { printf( "Original:\n" ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

clk = Abc_Clock();
    pMan = Ivy_ManBalance( pMan, fUpdateLevel );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Balance", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

//    Ivy_ManRewriteAlg( pMan, fUpdateLevel, 0 );
clk = Abc_Clock();
    Ivy_ManRewritePre( pMan, fUpdateLevel, 0, 0 );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Rewrite", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );

clk = Abc_Clock();
    pMan = Ivy_ManBalance( pTemp = pMan, fUpdateLevel );
    Ivy_ManStop( pTemp );
if ( fVerbose ) { printf( "\n" ); }
if ( fVerbose ) { ABC_PRT( "Balance", Abc_Clock() - clk ); }
if ( fVerbose ) Ivy_ManPrintStats( pMan );
    return pMan;
}